

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O3

void __thiscall
glu::sl::ShaderParser::parseExpectResult(ShaderParser *this,ExpectResult *expectResult)

{
  string *__rhs;
  int iVar1;
  ExpectResult EVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  assumeToken(this,TOKEN_IDENTIFIER);
  __rhs = &this->m_curTokenStr;
  iVar1 = std::__cxx11::string::compare((char *)__rhs);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar1 == 0) {
      EVar2 = EXPECT_COMPILE_FAIL;
      goto LAB_0089d3fc;
    }
    iVar1 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar1 == 0) {
      EVar2 = EXPECT_LINK_FAIL;
      goto LAB_0089d3fc;
    }
    iVar1 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar1 == 0) {
      EVar2 = EXPECT_COMPILE_LINK_FAIL;
      goto LAB_0089d3fc;
    }
    iVar1 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar1 == 0) {
      EVar2 = EXPECT_VALIDATION_FAIL;
      goto LAB_0089d3fc;
    }
    iVar1 = std::__cxx11::string::compare((char *)__rhs);
    EVar2 = EXPECT_BUILD_SUCCESSFUL;
    if (iVar1 == 0) goto LAB_0089d3fc;
    std::operator+(&local_38,"invalid expected result value: ",__rhs);
    parseError(this,&local_38);
    expectResult = (ExpectResult *)&local_38;
  }
  EVar2 = EXPECT_PASS;
LAB_0089d3fc:
  *expectResult = EVar2;
  advanceToken(this);
  return;
}

Assistant:

void ShaderParser::parseExpectResult (ExpectResult& expectResult)
{
	assumeToken(TOKEN_IDENTIFIER);

	if (m_curTokenStr == "pass")
		expectResult = EXPECT_PASS;
	else if (m_curTokenStr == "compile_fail")
		expectResult = EXPECT_COMPILE_FAIL;
	else if (m_curTokenStr == "link_fail")
		expectResult = EXPECT_LINK_FAIL;
	else if (m_curTokenStr == "compile_or_link_fail")
		expectResult = EXPECT_COMPILE_LINK_FAIL;
	else if (m_curTokenStr == "validation_fail")
		expectResult = EXPECT_VALIDATION_FAIL;
	else if (m_curTokenStr == "build_successful")
		expectResult = EXPECT_BUILD_SUCCESSFUL;
	else
		parseError(string("invalid expected result value: " + m_curTokenStr));

	advanceToken();
}